

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hashtbl.c
# Opt level: O0

hashtbl_node_t * hashtbl_get_node(cf_hashtbl_t *tbl,cf_void_t *key,cf_size_t len,cf_bool_t create)

{
  uint uVar1;
  int iVar2;
  hashtbl_node_t *phVar3;
  void *pvVar4;
  hashtbl_node_t **local_68;
  hashtbl_node_t **list_entry;
  hashtbl_node_t *node;
  cf_uint32_t hash;
  cf_bool_t create_local;
  cf_size_t len_local;
  cf_void_t *key_local;
  cf_hashtbl_t *tbl_local;
  uint local_2c;
  cf_uint8_t *pcStack_28;
  cf_uint32_t hash_1;
  cf_uint8_t *end;
  cf_uint8_t *p;
  cf_void_t *local_10;
  
  p = (cf_uint8_t *)&hash;
  pcStack_28 = (cf_uint8_t *)0x0;
  local_2c = 0;
  len_local = (cf_size_t)key;
  key_local = tbl;
  end = (cf_uint8_t *)key;
  local_10 = key;
  if (len == 0xffffffffffffffff) {
    _hash = (hashtbl_node_t *)0x0;
    while (*end != '\0') {
      local_2c = local_2c * 0x21 + (uint)*end;
      end = end + 1;
      *(long *)p = *(long *)p + 1;
    }
    *(long *)p = *(long *)p + 1;
  }
  else {
    pcStack_28 = (cf_uint8_t *)((long)key + len);
    for (; _hash = (hashtbl_node_t *)len, end != pcStack_28; end = end + 1) {
      local_2c = local_2c * 0x21 + (uint)*end;
    }
  }
  uVar1 = local_2c & *(uint *)((long)key_local + 0x10);
  local_68 = (hashtbl_node_t **)(*key_local + (ulong)uVar1 * 8);
  list_entry = (hashtbl_node_t **)*local_68;
  while( true ) {
    if (list_entry == (hashtbl_node_t **)0x0) {
      if (create == 0) {
        tbl_local = (cf_hashtbl_t *)0x0;
      }
      else {
        phVar3 = (hashtbl_node_t *)calloc(1,0x30);
        phVar3->tbl = (cf_hashtbl_t *)key_local;
        phVar3->hash = uVar1;
        pvVar4 = malloc((size_t)_hash);
        phVar3->key = pvVar4;
        phVar3->keylen = (cf_size_t)_hash;
        cf_memcpy_s(phVar3->key,(cf_size_t)_hash,(cf_void_t *)len_local,(cf_size_t)_hash);
        *local_68 = phVar3;
        *(long *)((long)key_local + 8) = *(long *)((long)key_local + 8) + 1;
        tbl_local = (cf_hashtbl_t *)phVar3;
      }
      return (hashtbl_node_t *)tbl_local;
    }
    if ((((*(uint *)(list_entry + 2) == uVar1) && (_hash == list_entry[4])) &&
        (list_entry[3] != (hashtbl_node_t *)0x0)) &&
       (iVar2 = memcmp(list_entry[3],(void *)len_local,(size_t)_hash), iVar2 == 0)) break;
    local_68 = list_entry + 1;
    list_entry = (hashtbl_node_t **)*local_68;
  }
  return (hashtbl_node_t *)list_entry;
}

Assistant:

hashtbl_node_t* hashtbl_get_node(cf_hashtbl_t* tbl, const cf_void_t* key, cf_size_t len, cf_bool_t create) {
    cf_uint32_t hash = 0;
    hashtbl_node_t* node = CF_NULL_PTR, **list_entry = CF_NULL_PTR;

    hash = cf_hashtbl_calc_hash(key, &len) & tbl->hashmsk;

    for (list_entry = &tbl->table[hash], node = *list_entry;
         node;
         list_entry = &node->next, node = *list_entry) {
        if (node->hash == hash && len == node->keylen
            && node->key != CF_NULL_PTR && memcmp(node->key, key, len) == 0) {
            return node;
        }
    }

    if (!create) {
        return CF_NULL_PTR;
    }

    node = cf_malloc_z_native(sizeof(hashtbl_node_t));
    node->tbl = tbl;
    node->hash = hash; 
    node->key = cf_malloc_native(len);
    node->keylen = len;
    cf_memcpy_s(node->key, len, key, len);

    *list_entry = node;
    tbl->size++;
    return node;
}